

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_b4b9b9::CompileDeferred
          (anon_unknown_dwarf_b4b9b9 *this,TCompiler *compiler,char **shaderStrings,int numStrings,
          int *inputLengths,char **stringNames,char *preamble,EShOptimizationLevel optLevel,
          TBuiltInResource *resources,int defaultVersion,EProfile defaultProfile,
          bool forceDefaultVersionAndProfile,int overrideVersion,bool forwardCompatible,
          EShMessages messages,TIntermediate *intermediate,Includer *includer,
          string sourceEntryPointName,TEnvironment *environment,bool compileOnly)

{
  anon_unknown_dwarf_b4b9b9 *paVar1;
  int *piVar2;
  _func_int **__s;
  TSymbolTable *symTable;
  TInfoSink *infoSink;
  SpvVersion spvVersion_00;
  string sourceEntryPointName_00;
  undefined4 uVar3;
  EShMessages EVar4;
  char **names;
  EShSource source;
  bool versionNotFirst;
  bool bVar5;
  uint uVar6;
  int iVar7;
  TPoolAllocator *this_00;
  char **s;
  size_t sVar8;
  undefined7 extraout_var;
  undefined8 uVar9;
  undefined7 extraout_var_00;
  __uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
  this_01;
  TParseContextBase *pc;
  long lVar10;
  TInfoSinkBase *pTVar11;
  undefined4 in_register_0000000c;
  bool *notFirstToken;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  TIntermediate *pTVar15;
  size_t *psVar16;
  char *pcVar17;
  undefined4 in_stack_00000014;
  undefined3 in_stack_00000031;
  undefined3 in_stack_00000041;
  undefined4 in_stack_0000004c;
  undefined1 auStack_638 [14];
  bool local_62a;
  bool versionNotFirstToken;
  EProfile profile;
  int version;
  EShMessages local_620;
  uint local_61c;
  undefined4 local_618;
  EShMessages local_614;
  anon_unknown_dwarf_b4b9b9 *local_610;
  size_t *local_608;
  int *local_600;
  int postIndex;
  EShMessages local_5f0;
  EShLanguage stage;
  char **local_5e8;
  EProfile local_5e0;
  int local_5dc;
  SpvVersion spvVersion;
  string local_5a8;
  unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_> symbolTable;
  EShSource sourceGuess;
  uint local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  bool local_568;
  undefined3 uStack_567;
  string preamble_1;
  long *local_538 [2];
  long local_528 [2];
  TSourceLoc loc;
  TSourceLoc *local_4e8;
  TScanContext scanContext;
  TInputScanner userInput;
  TPpContext ppContext;
  
  uVar12 = (ulong)shaderStrings & 0xffffffff;
  local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
  local_610 = this;
  local_600 = inputLengths;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a8,includer,sourceEntryPointName._M_dataplus._M_p + (long)includer);
  local_614 = _forwardCompatible;
  this_00 = glslang::GetThreadPoolAllocator();
  glslang::TPoolAllocator::push(this_00);
  iVar7 = (int)shaderStrings;
  if (iVar7 == 0) {
    bVar5 = true;
    goto LAB_0034b88a;
  }
  uVar14 = 0xffffffffffffffff;
  if (-4 < iVar7) {
    uVar14 = (ulong)(iVar7 + 3U) * 8;
  }
  local_608 = (size_t *)operator_new__(uVar14);
  s = (char **)operator_new__(uVar14);
  local_5e8 = (char **)operator_new__(uVar14);
  _postIndex = uVar12;
  if (0 < iVar7) {
    uVar14 = 0;
    do {
      __s = (&(compiler->super_TShHandleBase)._vptr_TShHandleBase)[uVar14];
      s[uVar14 + 2] = (char *)__s;
      if ((CONCAT44(in_register_0000000c,numStrings) == 0) ||
         (sVar8 = (size_t)*(int *)(CONCAT44(in_register_0000000c,numStrings) + uVar14 * 4),
         (long)sVar8 < 0)) {
        sVar8 = strlen((char *)__s);
      }
      local_608[uVar14 + 2] = sVar8;
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
    if (local_600 == (int *)0x0) {
      memset(local_5e8 + 2,0,uVar12 << 3);
    }
    else {
      memcpy(local_5e8 + 2,local_600,uVar12 << 3);
    }
  }
  paVar1 = local_610;
  lVar10 = CONCAT44(in_stack_0000004c,messages);
  sourceGuess = EShSourceHlsl - ((forwardCompatible & 0x40U) == 0);
  spvVersion.spv = 0;
  spvVersion.vulkanGlsl = 0;
  spvVersion.vulkan = 0;
  spvVersion.openGl = 0;
  spvVersion._16_4_ = spvVersion._16_4_ & 0xffffff00;
  stage = *(EShLanguage *)(local_610 + 0x18);
  TranslateEnvironment
            ((TEnvironment *)sourceEntryPointName._M_string_length,&local_614,&sourceGuess,&stage,
             &spvVersion);
  source = sourceGuess;
  psVar16 = local_608;
  if ((sourceEntryPointName._M_string_length != 0) &&
     (*(char *)(sourceEntryPointName._M_string_length + 0x24) == '\x01')) {
    *(undefined1 *)(lVar10 + 0x338) = 1;
  }
  glslang::TInputScanner::TInputScanner
            (&userInput,(int)_postIndex,s + 2,local_608 + 2,(char **)0x0,0,0,false);
  version = 0;
  profile = ENoProfile;
  versionNotFirstToken = false;
  if (source == EShSourceHlsl) {
    local_610 = paVar1 + 0x10;
    local_600 = (int *)(ulong)stage;
    version = 500;
    profile = ECoreProfile;
    local_62a = true;
    local_618 = 0;
    local_61c = (uint)CONCAT71((uint7)(uint3)(stage >> 8),1);
    local_620 = EShMsgDefault;
    pTVar15 = (TIntermediate *)CONCAT44(in_stack_0000004c,messages);
  }
  else {
    notFirstToken = &versionNotFirstToken;
    versionNotFirst =
         glslang::TInputScanner::scanVersion(&userInput,&version,&profile,notFirstToken);
    uVar3 = in_stack_0000004c;
    bVar5 = version == 0;
    local_618 = (undefined4)CONCAT71((int7)((ulong)notFirstToken >> 8),source == EShSourceGlsl);
    if (((undefined1)defaultProfile & source == EShSourceGlsl) == ENoProfile) {
      if ((local_614 & EShMsgSuppressWarnings) == EShMsgDefault && version != 0) {
        if ((version != (int)resources) || (profile != defaultVersion)) {
          pTVar11 = *(TInfoSinkBase **)(local_610 + 0x10);
          glslang::TInfoSinkBase::append(pTVar11,"Warning, (version, profile) forced to be (");
          pTVar11 = glslang::TInfoSinkBase::operator<<(pTVar11,(int)resources);
          glslang::TInfoSinkBase::append(pTVar11,", ");
          pcVar17 = "unknown profile";
          if (defaultVersion - 1U < 8) {
            pcVar17 = (char *)(&DAT_00923038)[defaultVersion - 1U];
          }
          glslang::TInfoSinkBase::append(pTVar11,pcVar17);
          glslang::TInfoSinkBase::append(pTVar11,"), while in source code it is (");
          pTVar11 = glslang::TInfoSinkBase::operator<<(pTVar11,version);
          glslang::TInfoSinkBase::append(pTVar11,", ");
          pcVar17 = "unknown profile";
          if (profile - ENoProfile < 8) {
            pcVar17 = (char *)(&DAT_00923038)[profile - ENoProfile];
          }
          glslang::TInfoSinkBase::append(pTVar11,pcVar17);
          glslang::TInfoSinkBase::append(pTVar11,")\n");
        }
      }
      else if (version == 0) {
        versionNotFirstToken = false;
        versionNotFirst = false;
      }
      version = (int)resources;
      profile = defaultVersion;
      bVar5 = false;
    }
    pTVar15 = (TIntermediate *)CONCAT44(uVar3,messages);
    if (_forceDefaultVersionAndProfile == 0 || source != EShSourceGlsl) {
      paVar1 = local_610 + 0x10;
      local_610 = local_610 + 0x10;
      local_600 = (int *)(ulong)stage;
      local_62a = DeduceVersionProfile
                            (*(TInfoSink **)paVar1,stage,versionNotFirst,(int)resources,source,
                             &version,&profile,&spvVersion);
      uVar9 = CONCAT71(extraout_var_00,local_62a);
      if (!bVar5) goto LAB_0034b1a2;
LAB_0034b1c0:
      local_61c = (uint)CONCAT71((int7)((ulong)uVar9 >> 8),1);
    }
    else {
      version = _forceDefaultVersionAndProfile;
      paVar1 = local_610 + 0x10;
      local_610 = local_610 + 0x10;
      local_600 = (int *)(ulong)stage;
      local_62a = DeduceVersionProfile
                            (*(TInfoSink **)paVar1,stage,versionNotFirst,(int)resources,
                             EShSourceGlsl,&version,&profile,&spvVersion);
      uVar9 = CONCAT71(extraout_var,1);
      local_618 = (undefined4)uVar9;
      if (!bVar5) {
LAB_0034b1a2:
        uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),profile == EEsProfile);
        if ((versionNotFirst & (299 < version && profile == EEsProfile)) == 0) {
          psVar16 = local_608;
          if (versionNotFirstToken == true) {
            local_620 = local_614 & EShMsgRelaxedErrors;
            local_61c = (uint)(local_620 == EShMsgDefault);
          }
          else {
            local_61c = 0;
            local_620 = EShMsgDefault;
          }
          goto LAB_0034b1d3;
        }
        goto LAB_0034b1c0;
      }
      local_61c = (uint)CONCAT71(extraout_var,1);
    }
    local_620 = EShMsgDefault;
    psVar16 = local_608;
  }
LAB_0034b1d3:
  pTVar15->source = source;
  pTVar15->version = version;
  pTVar15->profile = profile;
  glslang::TIntermediate::setSpv(pTVar15,&spvVersion);
  EVar4 = local_614;
  RecordProcesses(pTVar15,local_614,&local_5a8);
  if (0 < spvVersion.vulkan) {
    pTVar15->originUpperLeft = true;
  }
  if (source == EShSourceHlsl || (EVar4 >> 9 & 1) != 0) {
    pTVar15->hlslOffsets = true;
    glslang::TProcesses::addProcess(&pTVar15->processes,"hlsl-offsets");
  }
  local_5f0 = EVar4;
  if ((EVar4 >> 10 & 1) != 0) {
    glslang::TIntermediate::setSourceFile
              ((TIntermediate *)CONCAT44(in_stack_0000004c,messages),local_5e8[2]);
    if (0 < postIndex) {
      lVar10 = CONCAT44(in_stack_0000004c,messages);
      uVar12 = _postIndex & 0xffffffff;
      uVar14 = 0;
      do {
        std::__cxx11::string::append((char *)(lVar10 + 0x780),(ulong)s[uVar14 + 2]);
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
    }
  }
  bVar5 = SetupBuiltinSymbolTable(version,profile,&spvVersion,source);
  if (bVar5) {
    uVar6 = MapVersionToIndex(version);
    uVar12 = 1;
    lVar10 = CONCAT44(in_stack_0000004c,messages);
    if (spvVersion.openGl < 1) {
      if (spvVersion.vulkan < 1) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)spvVersion.vulkanRelaxed | 2;
      }
    }
    if (profile - ECoreProfile < 7) {
      lVar13 = (&DAT_006e7f38)[profile - ECoreProfile];
    }
    else {
      lVar13 = 0;
    }
    symTable = (TSymbolTable *)
               (&(anonymous_namespace)::SharedSymbolTables)
               [uVar12 * 0x70 +
                lVar13 * 0x1c +
                (ulong)(source == EShSourceHlsl) * 0xe +
                (ulong)uVar6 * 0x1c0 + ((ulong)local_600 & 0xffffffff)];
    this_01.
    super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t.
    super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
    super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
         (__uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>)
         operator_new(0x28);
    *(uint *)((long)this_01.
                    super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                    .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x24) = 0;
    *(undefined8 *)
     this_01.
     super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t.
     super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
     super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl = 0;
    *(pointer *)
     ((long)this_01.
            super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
            .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 8) = (pointer)0x0;
    *(pointer *)
     ((long)this_01.
            super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
            .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x10) =
         (pointer)0x0;
    *(longlong *)
     ((long)this_01.
            super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
            .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) = 0;
    *(undefined2 *)
     ((long)this_01.
            super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
            .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x20) = 0;
    symbolTable._M_t.
    super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>._M_t.
    super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>.
    super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl =
         (__uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
          )(__uniq_ptr_data<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>,_true,_true>
            )this_01.
             super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
             .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl;
    if (symTable != (TSymbolTable *)0x0) {
      glslang::TSymbolTable::adoptLevels
                ((TSymbolTable *)
                 this_01.
                 super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                 .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,symTable);
    }
    paVar1 = local_610;
    uVar12 = *(ulong *)(lVar10 + 0x298);
    if (uVar12 != 0) {
      uVar6 = (int)((ulong)((long)*(pointer *)
                                   ((long)this_01.
                                          super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                          .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>.
                                          _M_head_impl + 8) -
                           *(long *)this_01.
                                    super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                                    .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>.
                                    _M_head_impl) >> 3) - 1;
      uVar14 = 0x7f00000000000000;
      if (uVar6 < 0x80) {
        uVar14 = (ulong)uVar6 << 0x38;
      }
      *(ulong *)((long)this_01.
                       super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                       .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18) =
           uVar12 & 0xffffffffffffff | uVar14;
    }
    bVar5 = AddContextSpecificSymbols
                      ((TBuiltInResource *)CONCAT44(in_stack_00000014,optLevel),
                       *(TInfoSink **)local_610,
                       (TSymbolTable *)
                       this_01.
                       super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                       .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,version,
                       profile,&spvVersion,(EShLanguage)local_600,source);
    if (bVar5) {
      if ((local_5f0 >> 0xe & 1) != 0) {
        DumpBuiltinSymbolTable
                  (*(TInfoSink **)paVar1,
                   (TSymbolTable *)
                   this_01.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
      }
      local_5dc = version;
      local_5e0 = profile;
      infoSink = *(TInfoSink **)paVar1;
      local_578 = spvVersion.spv;
      iStack_574 = spvVersion.vulkanGlsl;
      iStack_570 = spvVersion.vulkan;
      iStack_56c = spvVersion.openGl;
      local_568 = spvVersion.vulkanRelaxed;
      uStack_567 = spvVersion._17_3_;
      local_538[0] = local_528;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_538,local_5a8._M_dataplus._M_p,
                 local_5a8._M_dataplus._M_p + local_5a8._M_string_length);
      spvVersion_00.vulkanGlsl = iStack_574;
      spvVersion_00.spv = local_578;
      spvVersion_00.openGl = iStack_56c;
      spvVersion_00.vulkan = iStack_570;
      spvVersion_00.vulkanRelaxed = local_568;
      spvVersion_00._17_3_ = uStack_567;
      sourceEntryPointName_00._8_14_ = auStack_638;
      sourceEntryPointName_00._M_dataplus._M_p = (pointer)local_538;
      sourceEntryPointName_00.field_2._M_local_buf[6] = local_62a;
      sourceEntryPointName_00.field_2._M_local_buf[7] = versionNotFirstToken;
      sourceEntryPointName_00.field_2._8_4_ = profile;
      sourceEntryPointName_00.field_2._12_4_ = version;
      pc = CreateParseContext((TSymbolTable *)
                              this_01.
                              super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                              .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl,
                              (TIntermediate *)CONCAT44(in_stack_0000004c,messages),local_5dc,
                              local_5e0,source,(EShLanguage)local_600,infoSink,spvVersion_00,
                              SUB41(overrideVersion,0),local_5f0,false,sourceEntryPointName_00);
      if (local_538[0] != local_528) {
        operator_delete(local_538[0],local_528[0] + 1);
      }
      pc->compileOnly = (bool)sourceEntryPointName.field_2._M_local_buf[0];
      pcVar17 = "";
      if (local_5e8[2] != (char *)0x0) {
        pcVar17 = local_5e8[2];
      }
      loc.name = (TString *)&loc.column;
      sVar8 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&loc,pcVar17,pcVar17 + sVar8);
      glslang::TPpContext::TPpContext(&ppContext,pc,(string *)&loc,(Includer *)intermediate);
      if (loc.name != (TString *)&loc.column) {
        operator_delete(loc.name,CONCAT44(loc._20_4_,loc.column) + 1);
      }
      scanContext._vptr_TScanContext = (_func_int **)&PTR__TScanContext_009230a8;
      scanContext.afterType = false;
      scanContext.afterStruct = false;
      scanContext.field = false;
      scanContext.afterBuffer = false;
      if ((char)local_618 != '\0') {
        pc->scanContext = &scanContext;
      }
      pc->ppContext = &ppContext;
      scanContext.parseContext = pc;
      (*(pc->super_TParseVersions)._vptr_TParseVersions[0x31])
                (pc,CONCAT44(in_stack_00000014,optLevel));
      if (local_62a == false) {
        piVar2 = &(pc->super_TParseVersions).numErrors;
        *piVar2 = *piVar2 + 1;
      }
      _postIndex = (ulong)((int)_postIndex + 2);
      if ((undefined1)local_620 != '\0') {
        loc.name = (TString *)0x0;
        loc.string = 0;
        loc.line = 0;
        loc.column = 0;
        (*(pc->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (pc,&loc,"Illegal to have non-comment, non-whitespace tokens before #version",
                   "#version","");
      }
      (*(pc->super_TParseVersions)._vptr_TParseVersions[2])(pc);
      preamble_1._M_dataplus._M_p = (pointer)&preamble_1.field_2;
      preamble_1._M_string_length = 0;
      preamble_1.field_2._M_local_buf[0] = '\0';
      glslang::TParseVersions::getPreamble(&pc->super_TParseVersions,&preamble_1);
      *s = preamble_1._M_dataplus._M_p;
      sVar8 = strlen(preamble_1._M_dataplus._M_p);
      names = local_5e8;
      psVar16 = local_608;
      *local_608 = sVar8;
      *local_5e8 = (char *)0x0;
      s[1] = (char *)stringNames;
      sVar8 = strlen((char *)stringNames);
      psVar16[1] = sVar8;
      names[1] = (char *)0x0;
      lVar10 = (long)postIndex;
      s[lVar10] = "\n int;";
      psVar16[lVar10] = 6;
      names[lVar10] = (char *)0x0;
      glslang::TInputScanner::TInputScanner
                ((TInputScanner *)&loc,iVar7 + 3U,s,psVar16,names,2,1,false);
      glslang::TSymbolTable::push
                ((TSymbolTable *)
                 this_01.
                 super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                 .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl);
      iVar7 = (*(pc->super_TParseVersions)._vptr_TParseVersions[0x3b])
                        (pc,&ppContext,(TInputScanner *)&loc,(ulong)(byte)local_61c);
      if ((char)iVar7 == '\0') {
        glslang::TInfoSinkBase::append(&((pc->super_TParseVersions).infoSink)->info,"ERROR: ");
        pTVar11 = glslang::TInfoSinkBase::operator<<
                            (&((pc->super_TParseVersions).infoSink)->info,
                             (pc->super_TParseVersions).numErrors);
        glslang::TInfoSinkBase::append(pTVar11," compilation errors.  No code generated.\n\n");
        bVar5 = false;
        pTVar15 = (TIntermediate *)CONCAT44(in_stack_0000004c,messages);
      }
      else {
        pTVar15 = (TIntermediate *)CONCAT44(in_stack_0000004c,messages);
        bVar5 = true;
        if (pTVar15->treeRoot != (TIntermNode *)0x0) {
          if ((int)preamble == 0) {
            glslang::TInfoSinkBase::message
                      (&((pc->super_TParseVersions).infoSink)->info,EPrefixNone,
                       "No errors.  No code generation or linking was requested.");
          }
          else {
            bVar5 = glslang::TIntermediate::postProcess
                              (pTVar15,pTVar15->treeRoot,(pc->super_TParseVersions).language);
          }
        }
      }
      if ((local_5f0 & EShMsgAST) != EShMsgDefault) {
        glslang::TIntermediate::output(pTVar15,(pc->super_TParseVersions).infoSink,true);
      }
      pTVar15->uniqueId =
           *(longlong *)
            ((long)this_01.
                   super___uniq_ptr_impl<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_glslang::TSymbolTable_*,_std::default_delete<glslang::TSymbolTable>_>
                   .super__Head_base<0UL,_glslang::TSymbolTable_*,_false>._M_head_impl + 0x18);
      loc.name = (TString *)&PTR__TInputScanner_00923088;
      if (local_4e8 != (TSourceLoc *)0x0) {
        operator_delete__(local_4e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)preamble_1._M_dataplus._M_p != &preamble_1.field_2) {
        operator_delete(preamble_1._M_dataplus._M_p,
                        CONCAT71(preamble_1.field_2._M_allocated_capacity._1_7_,
                                 preamble_1.field_2._M_local_buf[0]) + 1);
      }
      glslang::TPpContext::~TPpContext(&ppContext);
      (*(pc->super_TParseVersions)._vptr_TParseVersions[1])(pc);
      psVar16 = local_608;
    }
    else {
      bVar5 = false;
    }
    std::unique_ptr<glslang::TSymbolTable,_std::default_delete<glslang::TSymbolTable>_>::~unique_ptr
              (&symbolTable);
  }
  else {
    bVar5 = false;
  }
  userInput._vptr_TInputScanner = (_func_int **)&PTR__TInputScanner_00923088;
  if (userInput.loc != (TSourceLoc *)0x0) {
    operator_delete__(userInput.loc);
  }
  operator_delete__(local_5e8);
  operator_delete__(s);
  operator_delete__(psVar16);
LAB_0034b88a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool CompileDeferred(
    TCompiler* compiler,
    const char* const shaderStrings[],
    const int numStrings,
    const int* inputLengths,
    const char* const stringNames[],
    const char* preamble,
    const EShOptimizationLevel optLevel,
    const TBuiltInResource* resources,
    int defaultVersion,         // use 100 for ES environment, 110 for desktop
    EProfile defaultProfile,
    bool forceDefaultVersionAndProfile,
    int overrideVersion,        // use 0 if not overriding GLSL version
    bool forwardCompatible,     // give errors for use of deprecated features
    EShMessages messages,       // warnings/errors/AST; things to print out
    TIntermediate& intermediate,// returned tree, etc.
    TShader::Includer& includer,
    const std::string sourceEntryPointName = "",
    TEnvironment* environment = nullptr,
    bool compileOnly = false)
{
    DoFullParse parser;
    return ProcessDeferred(compiler, shaderStrings, numStrings, inputLengths, stringNames,
                           preamble, optLevel, resources, defaultVersion,
                           defaultProfile, forceDefaultVersionAndProfile, overrideVersion,
                           forwardCompatible, messages, intermediate, parser,
                           true, includer, sourceEntryPointName, environment, compileOnly);
}